

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

uint32_t getsectid(Section *sect)

{
  uint32_t local_1c;
  Section *pSStack_18;
  uint32_t ID;
  Section *sec;
  Section *sect_local;
  
  pSStack_18 = sectionList;
  local_1c = 0;
  while( true ) {
    if (pSStack_18 == (Section *)0x0) {
      fatalerror("Unknown section \'%s\'\n",sect->name);
    }
    if (pSStack_18 == sect) break;
    local_1c = local_1c + 1;
    pSStack_18 = pSStack_18->next;
  }
  return local_1c;
}

Assistant:

static uint32_t getsectid(struct Section const *sect)
{
	struct Section const *sec = sectionList;
	uint32_t ID = 0;

	while (sec) {
		if (sec == sect)
			return ID;
		ID++;
		sec = sec->next;
	}

	fatalerror("Unknown section '%s'\n", sect->name);
}